

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Item.cpp
# Opt level: O2

void __thiscall Item::PrintItem(Item *this)

{
  uint uVar1;
  ostream *poVar2;
  char *pcVar3;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Card: ");
  poVar2 = std::operator<<(poVar2,(string *)&this->name);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Cost: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->cost);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<((ostream *)&std::cout,"Item Type: ");
  uVar1 = this->typeI - KATANA;
  if (uVar1 < 5) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             &DAT_0010e6c4 + *(int *)(&DAT_0010e6c4 + (ulong)uVar1 * 4));
    std::endl<char,std::char_traits<char>>(poVar2);
    pcVar3 = "Tapped: no";
    if (this->tapped != false) {
      pcVar3 = "Tapped: yes";
    }
    poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"Attack: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->attackBonus);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"Defense: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->defenseBonus);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"Minimum Honor Required: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->minimumHonor);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"Effect Bonus: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->effectBonus);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"Effect Cost: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->effectCost);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"Card text: ");
    poVar2 = std::operator<<(poVar2,(string *)&this->cardText);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"Durability: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->durability);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    return;
  }
  return;
}

Assistant:

void Item::PrintItem()                  //prints item's card stats
{
    cout << "Card: " << name << endl;
    cout << "Cost: " << cost << endl;

    cout << "Item Type: ";
    if (typeI == KATANA)
        cout << "Katana"<< endl;
    else if (typeI == SPEAR)
        cout << "Spear"<< endl;
    else if (typeI == BOW)
        cout << "Bow"<< endl;
    else if (typeI == NINJATO)
        cout << "Ninjato"<< endl;
    else if (typeI == WAKIZASHI)
        cout << "Wakizashi"<< endl;
    else return;

    if (tapped)
        cout << "Tapped: yes"<<endl;
    else
        cout <<"Tapped: no"<<endl;

    cout << "Attack: " << attackBonus << endl;
    cout << "Defense: " << defenseBonus << endl;
    cout << "Minimum Honor Required: " << minimumHonor << endl;

    cout << "Effect Bonus: " << effectBonus << endl;
    cout << "Effect Cost: " << effectCost << endl;

    cout << "Card text: " << cardText << endl;

    cout << "Durability: "<<durability<<endl;
    cout << endl;
}